

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ProfileId * __thiscall Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  ProfileId *pPVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  unsigned_short *mapping;
  uint local_54;
  uint i;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint count;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  pPVar4 = GetCallSiteToCallApplyCallSiteArray(this);
  if (pPVar4 != (ProfileId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19da,"(this->GetCallSiteToCallApplyCallSiteArray() == nullptr)",
                                "this->GetCallSiteToCallApplyCallSiteArray() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar3 = GetProfiledCallSiteCount(this);
  local_14 = (uint)PVar3;
  if (local_14 != 0) {
    pRVar6 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&unsigned_short::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x19de);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_40);
    mapping = Memory::AllocateArray<Memory::Recycler,unsigned_short,false>
                        ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)local_14)
    ;
    SetCallSiteToCallApplyCallSiteArray(this,mapping);
    for (local_54 = 0; local_54 < local_14; local_54 = local_54 + 1) {
      pPVar4 = GetCallSiteToCallApplyCallSiteArray(this);
      pPVar4[local_54] = 0xffff;
    }
  }
  pPVar4 = GetCallSiteToCallApplyCallSiteArray(this);
  return pPVar4;
}

Assistant:

ProfileId* FunctionBody::CreateCallSiteToCallApplyCallSiteArray()
    {
        Assert(this->GetCallSiteToCallApplyCallSiteArray() == nullptr);
        uint count = this->GetProfiledCallSiteCount();
        if (count != 0)
        {
            this->SetCallSiteToCallApplyCallSiteArray(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), ProfileId, count));
            for (uint i = 0; i < count; i++)
            {
                this->GetCallSiteToCallApplyCallSiteArray()[i] = Js::Constants::NoProfileId;
            }
        }
        return this->GetCallSiteToCallApplyCallSiteArray();
    }